

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocations.cpp
# Opt level: O0

void ast::Relocations::relocate(void)

{
  Location *pLVar1;
  bool bVar2;
  Value_type VVar3;
  uint uVar4;
  reference ppRVar5;
  ulong uVar6;
  uint local_1a4;
  string local_180;
  string local_160;
  allocator local_139;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  byte local_b1;
  string local_b0;
  uint local_8c;
  uint local_88;
  int value;
  uint mask;
  uint uStack_7c;
  uint16_t content;
  uint offset;
  uint section;
  string local_48;
  Relocation *local_28;
  Relocation *reloc;
  iterator __end1;
  iterator __begin1;
  list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_> *__range1;
  
  __end1 = std::__cxx11::list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_>::begin
                     ((list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_> *)list_abi_cxx11_
                     );
  reloc = (Relocation *)
          std::__cxx11::list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_>::end
                    ((list<ast::Relocation_*,_std::allocator<ast::Relocation_*>_> *)list_abi_cxx11_)
  ;
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&reloc);
    if (!bVar2) {
      return;
    }
    ppRVar5 = std::_List_iterator<ast::Relocation_*>::operator*(&__end1);
    local_28 = *ppRVar5;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_48,(string *)&local_28->symbol);
      VVar3 = Symbols::get_type(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      if (VVar3 != UNDEFINED) goto LAB_001524c8;
      pLVar1 = local_28->exp_location;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset,
                     "Undefined symbol: ",&local_28->symbol);
      error_report(pLVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &offset);
      std::__cxx11::string::~string((string *)&offset);
    }
    else {
LAB_001524c8:
      uStack_7c = local_28->section_index;
      mask = local_28->section_offset;
      value._2_2_ = Sections::read16(uStack_7c,mask);
      local_88 = -1 << ((byte)local_28->width & 0x1f) ^ 0xffffffff;
      local_8c = 0;
      uVar6 = std::__cxx11::string::empty();
      local_b1 = 0;
      if ((uVar6 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_b0,(string *)&local_28->symbol);
        local_b1 = 1;
        uVar4 = Symbols::get_section(&local_b0);
        local_1a4 = Sections::get_address(uVar4);
      }
      else {
        local_1a4 = 0;
      }
      local_8c = local_1a4 + local_28->addend;
      if ((local_b1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_b0);
      }
      if (local_28->type == RELATIVE) {
        if ((local_8c & 1) != 0) {
          pLVar1 = local_28->exp_location;
          string_printf_abi_cxx11_(&local_d8,"Target address is odd: %+d (0x%x)",(ulong)local_8c);
          warning_report(pLVar1,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        uVar4 = Sections::get_address(uStack_7c);
        local_8c = local_8c - (uVar4 + mask);
        if ((1 << ((byte)local_28->width & 0x1f) <= (int)local_8c) ||
           ((int)local_8c < -1 << ((byte)local_28->width & 0x1f))) {
          pLVar1 = local_28->exp_location;
          string_printf_abi_cxx11_
                    (&local_f8,
                     "Interval between PC and target address: %+d (0x%x), isn\'t codable in %d bit two\'s complementxx"
                     ,(ulong)local_8c,(ulong)local_8c,(ulong)(local_28->width + 1));
          error_report(pLVar1,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
        local_8c = (int)local_8c >> 1;
      }
      else if (local_28->type == RELATIVE_UNSIGNED) {
        if ((local_8c & 1) != 0) {
          pLVar1 = local_28->exp_location;
          string_printf_abi_cxx11_(&local_118,"Target address is odd: %+d (0x%x)",(ulong)local_8c);
          warning_report(pLVar1,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
        }
        uVar4 = Sections::get_address(uStack_7c);
        local_8c = local_8c - (uVar4 + mask);
        if ((int)local_8c < 0) {
          pLVar1 = local_28->exp_location;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_138,"Indicated address must be higher than current location",
                     &local_139);
          error_report(pLVar1,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::allocator<char>::~allocator((allocator<char> *)&local_139);
        }
        if (1 << ((char)local_28->width + 1U & 0x1f) <= (int)local_8c) {
          pLVar1 = local_28->exp_location;
          string_printf_abi_cxx11_
                    (&local_160,
                     "Interval between PC and target address: %+d (0x%x), isn\'t codable with %d bit"
                     ,(ulong)local_8c,(ulong)local_8c,(ulong)(local_28->width + 1));
          error_report(pLVar1,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
        }
        local_8c = (int)local_8c >> 1;
      }
      else if (1 << ((byte)local_28->width & 0x1f) < (int)local_8c) {
        pLVar1 = local_28->exp_location;
        string_printf_abi_cxx11_
                  (&local_180,"Expression\'s value: %d (0x%x) isn\'t codable in %d bit",
                   (ulong)local_8c,(ulong)local_8c,(ulong)local_28->width);
        error_report(pLVar1,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
      }
      value._2_2_ = value._2_2_ & ((ushort)(local_88 << ((byte)local_28->position & 0x1f)) ^ 0xffff)
                    | (ushort)((local_8c & local_88) << ((byte)local_28->position & 0x1f));
      Sections::write16(uStack_7c,mask,value._2_2_);
    }
    std::_List_iterator<ast::Relocation_*>::operator++(&__end1);
  } while( true );
}

Assistant:

void Relocations::relocate()
{
	for (auto reloc: list) {
		if ( ! reloc->symbol.empty()) {
			if (Symbols::get_type(reloc->symbol) == UNDEFINED) {
				error_report(reloc->exp_location, "Undefined symbol: " + reloc->symbol);
				continue;
			}
		}
		auto section = reloc->section_index;
		auto offset = reloc->section_offset;
		auto content = Sections::read16(section, offset);
		auto mask = MAKE_MASK(reloc->width, 0U);
		//  Saltos para endereços absolutos geram relocations relativas sem simbolo associado
		auto value = 0;	// Valor com sinal
		value = (reloc->symbol.empty() ? 0 : Sections::get_address(Symbols::get_section(reloc->symbol)))
				+ reloc->addend;
		if (reloc->type == Relocation::Relocation_type::RELATIVE) {
			// Nas instruções branch os offsets são codificados em número de instruções (value / 2)
			if (value & 1)
				warning_report(reloc->exp_location,
					string_printf("Target address is odd: %+d (0x%x)", value, value));
			value -= Sections::get_address(section) + offset;
			if (value >= (1 << reloc->width) || value < (~0 << reloc->width))	// signed
				error_report(reloc->exp_location,
						 string_printf("Interval between PC and target address: %+d (0x%x), "
								"isn't codable in %d bit two's complementxx",
								value, value, reloc->width + 1));
			value >>= 1;
		}
		else if (reloc->type == Relocation::Relocation_type::RELATIVE_UNSIGNED) {	// usado no ldr rd, label
			if (value & 1)
				warning_report(reloc->exp_location,
					string_printf("Target address is odd: %+d (0x%x)", value, value));
			value -= Sections::get_address(section) + offset;
			if (value < 0)
				error_report(reloc->exp_location,
							"Indicated address must be higher than current location");
			if (value >= (1 << (reloc->width + 1)))
				error_report(reloc->exp_location,
					string_printf("Interval between PC and target address: %+d (0x%x), "
							"isn't codable with %d bit",
							value, value, reloc->width + 1));
			value >>= 1;
		}
		else if (value > (1 << reloc->width)) { // Relocation::Type::ABSOLUTE
			error_report(reloc->exp_location,
				string_printf("Expression's value: %d (0x%x) isn't codable in %d bit",
					value, value, reloc->width));
		}
		content &= ~(mask << reloc->position);
		content |= (value & mask) << reloc->position;
		Sections::write16(section, offset, content);
	}
}